

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall
crnlib::symbol_codec::encode_transmit_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,bool simulate,
          static_huffman_data_model *pDeltaModel)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  static_huffman_data_model *in_RCX;
  byte in_DL;
  uint *in_RSI;
  uint extra_bits;
  uint extra;
  uint code_1;
  uint i_5;
  uint i_4;
  uint total_bits;
  uint num_codelength_codes_to_send;
  static_huffman_data_model dm;
  uint code;
  uint i_3;
  uint16 hist [21];
  uint len;
  uint i_2;
  int delta;
  uint i_1;
  vector<unsigned_char> delta_code_sizes;
  uint8 *pCodesizes;
  uint cur_nonzero_run_size;
  uint cur_zero_run_size;
  uint prev_len;
  vector<unsigned_short> codes;
  uint i;
  uint total_used_syms;
  uint in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint in_stack_fffffffffffffe7c;
  vector<unsigned_short> *in_stack_fffffffffffffe80;
  uint local_16c;
  int local_114;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  static_huffman_data_model local_f8;
  uint local_c0;
  uint local_bc;
  short local_b8 [25];
  undefined2 local_86;
  uint local_84;
  uint local_80;
  int local_7c;
  uint local_78;
  undefined4 local_74;
  vector<unsigned_char> local_70;
  byte *local_60;
  int local_58;
  int local_54;
  uint local_50;
  vector<unsigned_short> local_40;
  uint local_30;
  uint local_2c;
  static_huffman_data_model *local_28;
  byte local_19;
  uint *local_18;
  uint local_4;
  
  local_19 = in_DL & 1;
  local_2c = 0;
  local_28 = in_RCX;
  local_18 = in_RSI;
  for (local_30 = *in_RSI; local_30 != 0; local_30 = local_30 - 1) {
    puVar7 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(local_18 + 6),local_30 - 1)
    ;
    if (*puVar7 != '\0') {
      local_2c = local_30;
      break;
    }
  }
  if (local_2c == 0) {
    if ((local_19 & 1) == 0) {
      math::total_bits(0x2000);
      encode_bits((symbol_codec *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
    }
    uVar4 = math::total_bits(0x2000);
    return uVar4;
  }
  vector<unsigned_short>::vector(&local_40);
  vector<unsigned_short>::reserve(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  local_50 = 0xffffffff;
  local_54 = 0;
  local_58 = 0;
  local_60 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(local_18 + 6),0);
  vector<unsigned_char>::vector(&local_70);
  if ((local_28 != (static_huffman_data_model *)0x0) &&
     (uVar4 = static_huffman_data_model::get_total_syms(local_28), uVar4 != 0)) {
    uVar4 = vector<unsigned_char>::size(&local_28->m_code_sizes);
    if (uVar4 < local_2c) {
      local_4 = 0;
      local_74 = 1;
      goto LAB_00232640;
    }
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
    for (local_78 = 0; local_78 < local_2c; local_78 = local_78 + 1) {
      pbVar8 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(local_18 + 6),local_78);
      bVar1 = *pbVar8;
      pbVar8 = vector<unsigned_char>::operator[](&local_28->m_code_sizes,local_78);
      local_7c = (uint)bVar1 - (uint)*pbVar8;
      if (local_7c < 0) {
        local_7c = local_7c + 0x11;
      }
      uVar2 = (uchar)local_7c;
      puVar7 = vector<unsigned_char>::operator[](&local_70,local_78);
      *puVar7 = uVar2;
    }
    local_60 = vector<unsigned_char>::get_ptr(&local_70);
  }
  for (local_80 = 0; local_80 <= local_2c; local_80 = local_80 + 1) {
    if (local_80 < local_2c) {
      local_16c = (uint)*local_60;
      local_60 = local_60 + 1;
    }
    else {
      local_16c = 0xff;
    }
    local_84 = local_16c;
    if (local_16c == 0) {
      end_nonzero_run((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                      (vector<unsigned_short> *)
                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_54 = local_54 + 1;
      if (local_54 == 0x8a) {
        end_zero_run((uint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (vector<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
    }
    else {
      end_zero_run((uint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (vector<unsigned_short> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      uVar4 = (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      if (local_84 == local_50) {
        local_58 = local_58 + 1;
        if (local_58 == 0x46) {
          end_nonzero_run((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          uVar4,(vector<unsigned_short> *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        }
      }
      else {
        end_nonzero_run((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),uVar4,
                        (vector<unsigned_short> *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        if (local_84 != 0xff) {
          local_86 = (undefined2)local_84;
          vector<unsigned_short>::push_back
                    ((vector<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (unsigned_short *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                    );
        }
      }
    }
    local_50 = local_84;
  }
  utils::zero_object<unsigned_short[21]>((unsigned_short (*) [21])0x2321e5);
  for (local_bc = 0; uVar5 = local_bc, uVar4 = vector<unsigned_short>::size(&local_40),
      uVar5 < uVar4; local_bc = local_bc + 1) {
    puVar9 = vector<unsigned_short>::operator[](&local_40,local_bc);
    local_c0 = *puVar9 & 0xff;
    local_b8[local_c0] = local_b8[local_c0] + 1;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  uVar5 = static_huffman_data_model::init(&local_f8,(EVP_PKEY_CTX *)0x1);
  if ((uVar5 & 1) == 0) {
    local_4 = 0;
  }
  else {
    local_fc = 0x15;
    while ((local_fc != 0 &&
           (uVar4 = static_huffman_data_model::get_cost
                              ((static_huffman_data_model *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe4c), uVar4 == 0))) {
      local_fc = local_fc - 1;
    }
    uVar4 = math::total_bits(0x2000);
    local_100 = local_fc * 3 + uVar4 + 5;
    if ((local_19 & 1) == 0) {
      math::total_bits(0x2000);
      encode_bits((symbol_codec *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      encode_bits((symbol_codec *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      for (local_104 = 0; local_104 < local_fc; local_104 = local_104 + 1) {
        static_huffman_data_model::get_cost
                  ((static_huffman_data_model *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c);
        encode_bits((symbol_codec *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      }
    }
    local_108 = 0;
    while (uVar4 = local_108, uVar6 = vector<unsigned_short>::size(&local_40), uVar4 < uVar6) {
      puVar9 = vector<unsigned_short>::operator[](&local_40,local_108);
      uVar3 = *puVar9 & 0xff;
      local_114 = 0;
      if (uVar3 == 0x11) {
        local_114 = 3;
      }
      else if (uVar3 == 0x12) {
        local_114 = 7;
      }
      else if (uVar3 == 0x13) {
        local_114 = 2;
      }
      else if (uVar3 == 0x14) {
        local_114 = 6;
      }
      in_stack_fffffffffffffe54 =
           static_huffman_data_model::get_cost
                     ((static_huffman_data_model *)
                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe4c);
      local_100 = in_stack_fffffffffffffe54 + local_100;
      if ((local_19 & 1) == 0) {
        encode((symbol_codec *)CONCAT44(uVar6,uVar4),(uint)((ulong)puVar9 >> 0x20),
               (static_huffman_data_model *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
      if (local_114 != 0) {
        if ((local_19 & 1) == 0) {
          encode_bits((symbol_codec *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        }
        local_100 = local_114 + local_100;
      }
      local_108 = local_108 + 1;
    }
    local_4 = local_100;
  }
  local_74 = 1;
  static_huffman_data_model::~static_huffman_data_model
            ((static_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
LAB_00232640:
  vector<unsigned_char>::~vector
            ((vector<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))
  ;
  vector<unsigned_short>::~vector
            ((vector<unsigned_short> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
            );
  return local_4;
}

Assistant:

uint symbol_codec::encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate = false, static_huffman_data_model* pDeltaModel) {
  CRNLIB_ASSERT(m_mode == cEncoding);

  uint total_used_syms = 0;
  for (uint i = model.m_total_syms; i > 0; i--) {
    if (model.m_code_sizes[i - 1]) {
      total_used_syms = i;
      break;
    }
  }

  if (!total_used_syms) {
    if (!simulate) {
      encode_bits(0, math::total_bits(prefix_coding::cMaxSupportedSyms));
    }

    return math::total_bits(prefix_coding::cMaxSupportedSyms);
  }

  crnlib::vector<uint16> codes;
  codes.reserve(model.m_total_syms);

  uint prev_len = UINT_MAX;
  uint cur_zero_run_size = 0;
  uint cur_nonzero_run_size = 0;

  const uint8* pCodesizes = &model.m_code_sizes[0];

  crnlib::vector<uint8> delta_code_sizes;
  if ((pDeltaModel) && (pDeltaModel->get_total_syms())) {
    if (pDeltaModel->m_code_sizes.size() < total_used_syms)
      return 0;

    delta_code_sizes.resize(total_used_syms);
    for (uint i = 0; i < total_used_syms; i++) {
      int delta = (int)model.m_code_sizes[i] - (int)pDeltaModel->m_code_sizes[i];
      if (delta < 0)
        delta += 17;
      delta_code_sizes[i] = static_cast<uint8>(delta);
    }

    pCodesizes = delta_code_sizes.get_ptr();
  }

  for (uint i = 0; i <= total_used_syms; i++) {
    const uint len = (i < total_used_syms) ? *pCodesizes++ : 0xFF;
    CRNLIB_ASSERT((len == 0xFF) || (len <= prefix_coding::cMaxExpectedCodeSize));

    if (!len) {
      end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

      if (++cur_zero_run_size == cMaxLargeZeroRunSize)
        end_zero_run(cur_zero_run_size, codes);
    } else {
      end_zero_run(cur_zero_run_size, codes);

      if (len != prev_len) {
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

        if (len != 0xFF)
          codes.push_back(static_cast<uint16>(len));
      } else if (++cur_nonzero_run_size == cLargeMaxNonZeroRunSize)
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);
    }

    prev_len = len;
  }

  uint16 hist[cMaxCodelengthCodes];
  utils::zero_object(hist);

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i] & 0xFF;
    CRNLIB_ASSERT(code < cMaxCodelengthCodes);
    hist[code] = static_cast<uint16>(hist[code] + 1);
  }

  static_huffman_data_model dm;
  if (!dm.init(true, cMaxCodelengthCodes, hist, 7))
    return 0;

  uint num_codelength_codes_to_send;
  for (num_codelength_codes_to_send = cNumMostProbableCodelengthCodes; num_codelength_codes_to_send > 0; num_codelength_codes_to_send--)
    if (dm.get_cost(g_most_probable_codelength_codes[num_codelength_codes_to_send - 1]))
      break;

  uint total_bits = math::total_bits(prefix_coding::cMaxSupportedSyms);
  total_bits += 5;
  total_bits += 3 * num_codelength_codes_to_send;

  if (!simulate) {
    encode_bits(total_used_syms, math::total_bits(prefix_coding::cMaxSupportedSyms));

    encode_bits(num_codelength_codes_to_send, 5);
    for (uint i = 0; i < num_codelength_codes_to_send; i++)
      encode_bits(dm.get_cost(g_most_probable_codelength_codes[i]), 3);
  }

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i];
    uint extra = code >> 8;
    code &= 0xFF;

    uint extra_bits = 0;
    if (code == cSmallZeroRunCode)
      extra_bits = cSmallZeroRunExtraBits;
    else if (code == cLargeZeroRunCode)
      extra_bits = cLargeZeroRunExtraBits;
    else if (code == cSmallRepeatCode)
      extra_bits = cSmallNonZeroRunExtraBits;
    else if (code == cLargeRepeatCode)
      extra_bits = cLargeNonZeroRunExtraBits;

    total_bits += dm.get_cost(code);

    if (!simulate)
      encode(code, dm);

    if (extra_bits) {
      if (!simulate)
        encode_bits(extra, extra_bits);

      total_bits += extra_bits;
    }
  }

  return total_bits;
}